

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O3

void Omega_h::any::
     vtable_dynamic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::destroy(storage_union *storage)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)storage->dynamic;
  if (puVar1 != (undefined8 *)0x0) {
    if ((long *)*puVar1 != puVar1 + 2) {
      operator_delete((long *)*puVar1,puVar1[2] + 1);
    }
  }
  operator_delete(puVar1,0x20);
  return;
}

Assistant:

static void destroy(storage_union& storage) noexcept {
      // assert(reinterpret_cast<T*>(storage.dynamic));
      delete reinterpret_cast<T*>(storage.dynamic);
    }